

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_refit.h
# Opt level: O2

BBox3fa * __thiscall
embree::sse2::BVHNRefitT<4,_embree::TriangleMesh,_embree::TriangleMi<4>_>::leafBounds
          (BBox3fa *__return_storage_ptr__,
          BVHNRefitT<4,_embree::TriangleMesh,_embree::TriangleMi<4>_> *this,NodeRef *ref)

{
  ulong uVar1;
  TriangleMesh *pTVar2;
  long lVar3;
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  long lVar7;
  size_t i;
  long lVar8;
  ulong uVar9;
  long lVar10;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar11;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar12;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar13;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  uVar1 = ref->ptr;
  if (uVar1 == 8) {
    *(undefined8 *)&(__return_storage_ptr__->lower).field_0 = 0x7f8000007f800000;
    *(undefined8 *)((long)&(__return_storage_ptr__->lower).field_0 + 8) = 0x7f8000007f800000;
    *(undefined8 *)&(__return_storage_ptr__->upper).field_0 = 0xff800000ff800000;
    *(undefined8 *)((long)&(__return_storage_ptr__->upper).field_0 + 8) = 0xff800000ff800000;
  }
  else {
    pTVar2 = this->mesh;
    lVar6 = (uVar1 & 0xfffffffffffffff0) + 0x40;
    aVar11 = _DAT_01f45a40;
    aVar12 = _DAT_01f45a30;
    for (lVar7 = 0; lVar7 != (ulong)((uint)uVar1 & 0xf) - 8; lVar7 = lVar7 + 1) {
      lVar8 = 0;
      aVar13 = _DAT_01f45a40;
      aVar14 = _DAT_01f45a30;
      while ((lVar8 != 4 && (uVar9 = (ulong)*(uint *)(lVar6 + lVar8 * 4), uVar9 != 0xffffffff))) {
        lVar10 = uVar9 * *(long *)&pTVar2->field_0x68;
        lVar3 = *(long *)&(pTVar2->super_Geometry).field_0x58;
        pcVar4 = (pTVar2->vertices0).super_RawBufferView.ptr_ofs;
        sVar5 = (pTVar2->vertices0).super_RawBufferView.stride;
        auVar16 = minps(*(undefined1 (*) [16])(pcVar4 + *(uint *)(lVar3 + 4 + lVar10) * sVar5),
                        *(undefined1 (*) [16])(pcVar4 + *(uint *)(lVar3 + 8 + lVar10) * sVar5));
        auVar15 = maxps(*(undefined1 (*) [16])(pcVar4 + *(uint *)(lVar3 + 4 + lVar10) * sVar5),
                        *(undefined1 (*) [16])(pcVar4 + *(uint *)(lVar3 + 8 + lVar10) * sVar5));
        auVar16 = minps(*(undefined1 (*) [16])(pcVar4 + *(uint *)(lVar3 + lVar10) * sVar5),auVar16);
        auVar15 = maxps(*(undefined1 (*) [16])(pcVar4 + *(uint *)(lVar3 + lVar10) * sVar5),auVar15);
        aVar14.m128 = (__m128)minps(aVar14.m128,auVar16);
        aVar13.m128 = (__m128)maxps(aVar13.m128,auVar15);
        lVar8 = lVar8 + 1;
      }
      aVar12.m128 = (__m128)minps(aVar12.m128,aVar14.m128);
      aVar11.m128 = (__m128)maxps(aVar11.m128,aVar13.m128);
      lVar6 = lVar6 + 0x50;
    }
    (__return_storage_ptr__->lower).field_0 = aVar12;
    (__return_storage_ptr__->upper).field_0 = aVar11;
  }
  return __return_storage_ptr__;
}

Assistant:

virtual const BBox3fa leafBounds (NodeRef& ref) const
      {
        size_t num; char* prim = ref.leaf(num);
        if (unlikely(ref == BVH::emptyNode)) return empty;

        BBox3fa bounds = empty;
        for (size_t i=0; i<num; i++)
            bounds.extend(((Primitive*)prim)[i].update(mesh));
        return bounds;
      }